

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMatrixAttribute.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<double>_>::readValueFrom
          (TypedAttribute<Imath_2_5::Matrix44<double>_> *this,IStream *is,int size,int version)

{
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(double *)&this->_value);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[0] + 1);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[0] + 2);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[0] + 3);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[1]);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[1] + 1);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[1] + 2);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[1] + 3);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[2]);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[2] + 1);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[2] + 2);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[2] + 3);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[3]);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[3] + 1);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[3] + 2);
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(is,(this->_value).x[3] + 3);
  return;
}

Assistant:

void
M44dAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int size, int version)
{
    Xdr::read <StreamIO> (is, _value[0][0]);
    Xdr::read <StreamIO> (is, _value[0][1]);
    Xdr::read <StreamIO> (is, _value[0][2]);
    Xdr::read <StreamIO> (is, _value[0][3]);

    Xdr::read <StreamIO> (is, _value[1][0]);
    Xdr::read <StreamIO> (is, _value[1][1]);
    Xdr::read <StreamIO> (is, _value[1][2]);
    Xdr::read <StreamIO> (is, _value[1][3]);

    Xdr::read <StreamIO> (is, _value[2][0]);
    Xdr::read <StreamIO> (is, _value[2][1]);
    Xdr::read <StreamIO> (is, _value[2][2]);
    Xdr::read <StreamIO> (is, _value[2][3]);

    Xdr::read <StreamIO> (is, _value[3][0]);
    Xdr::read <StreamIO> (is, _value[3][1]);
    Xdr::read <StreamIO> (is, _value[3][2]);
    Xdr::read <StreamIO> (is, _value[3][3]);
}